

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.h
# Opt level: O0

Pointer * Faces_facexz_step(Faces *faces,int step)

{
  int iVar1;
  Pointer *pPVar2;
  int local_24;
  int step_local;
  Faces *faces_local;
  
  if (faces == (Faces *)0x0) {
    __assert_fail("faces != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.h"
                  ,0x7e,"Pointer *Faces_facexz_step(Faces *, int)");
  }
  if (-2 < step) {
    iVar1 = Faces_is_face_comm_async(faces);
    if (iVar1 == 0) {
      local_24 = 0;
    }
    else {
      local_24 = (step + 3) % 3;
    }
    pPVar2 = Faces_facexz(faces,local_24);
    return pPVar2;
  }
  __assert_fail("step >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.h"
                ,0x7f,"Pointer *Faces_facexz_step(Faces *, int)");
}

Assistant:

static Pointer* Faces_facexz_step( Faces* faces, int step )
{
  Assert( faces != NULL );
  Assert( step >= -1 );

  return Faces_facexz( faces,
                       Faces_is_face_comm_async( faces ) ? (step+3)%3 : 0 );
}